

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O0

int Dss_ObjCheckTransparent(Dss_Man_t *p,Dss_Obj_t *pObj)

{
  int iVar1;
  Dss_Obj_t *pDVar2;
  bool bVar3;
  int local_2c;
  Dss_Obj_t *pDStack_28;
  int i;
  Dss_Obj_t *pFanin;
  Dss_Obj_t *pObj_local;
  Dss_Man_t *p_local;
  
  if ((*(uint *)&pObj->field_0x4 & 7) == 2) {
    p_local._4_4_ = 1;
  }
  else if ((*(uint *)&pObj->field_0x4 & 7) == 3) {
    p_local._4_4_ = 0;
  }
  else if ((*(uint *)&pObj->field_0x4 & 7) == 4) {
    local_2c = 0;
    while( true ) {
      iVar1 = Dss_ObjFaninNum(pObj);
      bVar3 = false;
      if (local_2c < iVar1) {
        pDStack_28 = Dss_ObjFanin(p->vObjs,pObj,local_2c);
        bVar3 = pDStack_28 != (Dss_Obj_t *)0x0;
      }
      if (!bVar3) {
        return 0;
      }
      iVar1 = Dss_ObjCheckTransparent(p,pDStack_28);
      if (iVar1 != 0) break;
      local_2c = local_2c + 1;
    }
    p_local._4_4_ = 1;
  }
  else if ((*(uint *)&pObj->field_0x4 & 7) == 5) {
    pDVar2 = Dss_ObjFanin(p->vObjs,pObj,1);
    iVar1 = Dss_ObjCheckTransparent(p,pDVar2);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      pDVar2 = Dss_ObjFanin(p->vObjs,pObj,2);
      iVar1 = Dss_ObjCheckTransparent(p,pDVar2);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  else {
    if ((*(uint *)&pObj->field_0x4 & 7) != 6) {
      __assert_fail("pObj->Type == DAU_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauTree.c"
                    ,0x709,"int Dss_ObjCheckTransparent(Dss_Man_t *, Dss_Obj_t *)");
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Dss_ObjCheckTransparent( Dss_Man_t * p, Dss_Obj_t * pObj )
{
    Dss_Obj_t * pFanin;
    int i;
    if ( pObj->Type == DAU_DSD_VAR )
        return 1;
    if ( pObj->Type == DAU_DSD_AND )
        return 0;
    if ( pObj->Type == DAU_DSD_XOR )
    {
        Dss_ObjForEachFanin( p->vObjs, pObj, pFanin, i )
            if ( Dss_ObjCheckTransparent( p, pFanin ) )
                return 1;
        return 0;
    }
    if ( pObj->Type == DAU_DSD_MUX )
    {
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 1 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 2 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        return 1;
    }
    assert( pObj->Type == DAU_DSD_PRIME );
    return 0;
}